

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 455.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::section::Type<1,_455>::Type(Type<1,_455> *this,Type<1,_455> *param_1)

{
  double dVar1;
  undefined4 uVar2;
  
  uVar2 = *(undefined4 *)
           &(param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_455>_>).field_0x4;
  dVar1 = (param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_455>_>).atomicWeightRatio_;
  (this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_455>_>).ZA_ =
       (param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_455>_>).ZA_;
  *(undefined4 *)&(this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_455>_>).field_0x4 =
       uVar2;
  (this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_455>_>).atomicWeightRatio_ = dVar1;
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::Type<1,_455>::EnergyIndependentConstants,_njoy::ENDFtk::section::Type<1,_455>::EnergyDependentConstants>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::Type<1,_455>::EnergyIndependentConstants,_njoy::ENDFtk::section::Type<1,_455>::EnergyDependentConstants>
                     *)&this->lambda_,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<1,_455>::EnergyIndependentConstants,_njoy::ENDFtk::section::Type<1,_455>::EnergyDependentConstants>
                     *)&param_1->lambda_);
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
                     *)&this->nubar_,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
                     *)&param_1->nubar_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 1, 455 > :
    protected BaseWithoutMT< Type< 1, 455 > > {

    friend BaseWithoutMT< Type< 1, 455 > >;

  public:

    #include "ENDFtk/section/1/455/EnergyIndependentConstants.hpp"
    #include "ENDFtk/section/1/455/DecayConstants.hpp"
    #include "ENDFtk/section/1/455/EnergyDependentConstants.hpp"

    using DecayConstantData = std::variant< EnergyIndependentConstants, // LDG=0
                                            EnergyDependentConstants >; // LDG=1

    using Multiplicity = std::variant< PolynomialMultiplicity,  // LNU=1
                                       TabulatedMultiplicity >; // LNU=2

  private:

    /* fields */
    DecayConstantData lambda_;
    Multiplicity nubar_;

    /* auxiliary functions */
    #include "ENDFtk/section/1/455/src/readDecayConstantData.hpp"

  public:

    /* constructor */
    #include "ENDFtk/section/1/455/src/ctor.hpp"

    /* methods */

    /**
     *  @brief Return the fission multiplicity representation type
     */
    int LNU() const { return std::visit( [] ( const auto& v ) -> long
                                            { return v.LNU(); },
                                         this->nubar_ ); }

    /**
     *  @brief Return the fission multiplicity representation type
     */
    int representation() const { return this->LNU(); }

    /**
     *  @brief Return the type of decay constants
     */
    int LDG() const { return std::visit( [] ( const auto& v ) -> long
                                            { return v.LDG(); },
                                         this->lambda_ ); }

    /**
     *  @brief Return the type of decay constants
     */
    int type() const { return this->LDG(); }

    /**
     *  @brief Return the decay constant data for the delayed precursor groups
     */
    const DecayConstantData& delayedGroups() const { return this->lambda_; }

    /**
     *  @brief Return the fission multiplicity data
     */
    const Multiplicity& nubar() const { return this->nubar_; }

    /**
     *  @brief Return the number of lines in this MF1/MT455 section
     */
    long NC() const { return 1 + std::visit( [] ( const auto& v ) -> long
                                                { return v.NC(); },
                                             this->lambda_ )
                               + std::visit( [] ( const auto& v ) -> long
                                                { return v.NC(); },
                                             this->nubar_ ); }

    #include "ENDFtk/section/1/455/src/print.hpp"

    /**
     *  @brief Return the MT number of the section
     */
    static constexpr int sectionNumber(){ return 455; }

    using BaseWithoutMT::MT;
    using BaseWithoutMT::ZA;
    using BaseWithoutMT::targetIdentifier;
    using BaseWithoutMT::AWR;
    using BaseWithoutMT::atomicWeightRatio;
  }